

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  Builder *this_00;
  BrandScope *pBVar1;
  BrandedDecl *pBVar2;
  ErrorReporter *pEVar3;
  Resolver *pRVar4;
  undefined8 uVar5;
  Builder target;
  Reader source;
  Reader source_00;
  Reader type;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar6 [40];
  Builder target_01;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  StringPtr name_04;
  undefined8 uVar7;
  ReaderFor<bool> RVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  SegmentBuilder *pSVar12;
  SegmentBuilder *pSVar13;
  char *pcVar14;
  long lVar15;
  NodeTranslator *this_01;
  StructBuilder *__return_storage_ptr___00;
  NodeTranslator *this_02;
  char (*in_R8) [49];
  uint index;
  ElementCount index_00;
  char cVar16;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  DebugExpression<bool> _kjCondition;
  Vector<capnp::compiler::BrandScope_*> levels;
  Reader name;
  Builder scopes;
  Builder bindings;
  NullableValue<capnp::Schema> _annotationSchema2420;
  Reader annotation;
  Builder annotationBuilder;
  NullableValue<capnp::compiler::BrandedDecl> _decl2410;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  WirePointer *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *pOVar17;
  undefined1 uVar18;
  undefined7 uVar19;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar20;
  ArrayDisposer *pAVar21;
  undefined8 uVar22;
  uint uStack_478;
  undefined1 uStack_469;
  int local_468;
  undefined4 uStack_464;
  ArrayBuilder<capnp::compiler::BrandScope_*> local_458;
  Reader local_430;
  NodeTranslator *local_400;
  BrandScope *local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  size_t local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  BrandScope *local_3c8;
  ulong local_3c0;
  NullableValue<capnp::compiler::BrandedDecl> local_3b8;
  Reader local_308;
  Maybe<capnp::Schema> local_2d0;
  Builder local_2c0;
  StructBuilder local_298;
  StructReader local_270;
  Builder local_240;
  undefined1 local_218 [56];
  word local_1e0;
  undefined1 local_1c8 [40];
  AuxNode *pAStack_1a0;
  Reader local_198;
  Reader local_168 [2];
  NullableValue<capnp::compiler::BrandedDecl> local_108;
  ListBuilder local_58;
  
  local_3e0 = targetsFlagName.content.size_;
  local_3e8 = targetsFlagName.content.ptr;
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    pOVar17 = __return_storage_ptr__;
    local_400 = this;
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,annotations.reader.elementCount);
    capnp::_::OrphanGetImpl<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&local_58,&__return_storage_ptr__->builder);
    index = 0;
    local_3f0 = 0x205848;
    this_01 = local_400;
    __return_storage_ptr__ = pOVar17;
    while( true ) {
      __return_storage_ptr___00 = (StructBuilder *)(local_218 + 0x28);
      if (annotations.reader.elementCount <= index) break;
      capnp::_::ListReader::getStructElement(&local_270,&annotations.reader,index);
      capnp::_::ListBuilder::getStructElement(__return_storage_ptr___00,&local_58,index);
      capnp::schema::Annotation::Builder::initValue
                ((Builder *)&local_108,(Builder *)__return_storage_ptr___00);
      *(undefined2 *)local_108.field_1._8_8_ = 0;
      Declaration::AnnotationApplication::Reader::getName(&local_430,(Reader *)&local_270);
      pAVar21 = (ArrayDisposer *)0x0;
      uVar18 = 0;
      uVar19 = 0;
      aVar20 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
      local_468 = 0x7fffffff;
      implicitMethodParams.params.reader._39_1_ = uStack_469;
      implicitMethodParams.params.reader.structDataSize = 0;
      implicitMethodParams.params.reader.structPointerCount = 0;
      implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
      source._reader.capTable._0_4_ = (int)local_430._reader.capTable;
      source._reader.segment = local_430._reader.segment;
      source._reader.capTable._4_4_ = (int)((ulong)local_430._reader.capTable >> 0x20);
      source._reader.data._0_4_ = (int)local_430._reader.data;
      source._reader.data._4_4_ = (int)((ulong)local_430._reader.data >> 0x20);
      source._reader.pointers._0_4_ = (int)local_430._reader.pointers;
      source._reader.pointers._4_4_ = (int)((ulong)local_430._reader.pointers >> 0x20);
      source._reader.dataSize = local_430._reader.dataSize;
      source._reader._36_4_ = local_430._reader._36_4_;
      source._reader.nestingLimit = local_430._reader.nestingLimit;
      source._reader._44_4_ = local_430._reader._44_4_;
      auVar6 = ZEXT2440(ZEXT824(0));
      implicitMethodParams.scopeId = auVar6._0_8_;
      implicitMethodParams.params.reader.segment = (SegmentReader *)auVar6._8_8_;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar6._16_8_;
      implicitMethodParams.params.reader.ptr = (byte *)auVar6._24_8_;
      implicitMethodParams.params.reader.elementCount = auVar6._32_4_;
      implicitMethodParams.params.reader.step = auVar6._36_4_;
      implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
      implicitMethodParams.params.reader._44_4_ = uStack_464;
      BrandScope::compileDeclExpression
                ((Maybe<capnp::compiler::BrandedDecl> *)&local_3b8,(this_01->localBrand).ptr,source,
                 this_01->resolver,implicitMethodParams);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue(&local_108,&local_3b8);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_3b8);
      uVar9 = local_3b8.field_1._32_8_;
      if (local_108.isSet == true) {
        BrandedDecl::getKind(&local_108.field_1.value);
        if (local_3b8.isSet == true) {
          if (local_3b8._2_2_ == 0xb) {
            cVar16 = local_108.field_1.value.body.tag == 1;
            if (!(bool)cVar16) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)&local_3b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                         ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                         (DebugExpression<bool> *)&stack0xfffffffffffffb68);
              kj::_::Debug::Fault::fatal((Fault *)&local_3b8);
            }
            local_458.endPtr = (BrandScope **)0x0;
            local_458.ptr = (BrandScope **)0x0;
            local_458.pos = (BrandScope **)0x0;
            local_458.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
            local_3c8 = local_108.field_1.value.brand.ptr;
            uVar9 = local_108.field_1.value.brand.ptr;
            do {
              local_3f8 = (BrandScope *)uVar9;
              if (((((BrandScope *)uVar9)->params).size_ != 0) ||
                 ((((BrandScope *)uVar9)->inherited == true &&
                  (((BrandScope *)uVar9)->leafParamCount != 0)))) {
                kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                          ((Vector<capnp::compiler::BrandScope*> *)&local_458,&local_3f8);
              }
              uVar9 = (local_3f8->parent).ptr.ptr;
            } while ((BrandScope *)uVar9 != (BrandScope *)0x0);
            if (local_458.pos != local_458.ptr) {
              capnp::schema::Annotation::Builder::initBrand
                        ((Builder *)&stack0xfffffffffffffb68,(Builder *)__return_storage_ptr___00);
              capnp::schema::Brand::Builder::initScopes
                        ((Builder *)&local_3b8,(Builder *)&stack0xfffffffffffffb68,
                         (uint)((ulong)((long)local_458.pos - (long)local_458.ptr) >> 3));
              local_3d0 = (long)local_458.pos - (long)local_458.ptr >> 3;
              uVar11 = 0;
              while( true ) {
                if (uVar11 == local_3d0) break;
                capnp::_::ListBuilder::getStructElement
                          ((StructBuilder *)&stack0xfffffffffffffb68,(ListBuilder *)&local_3b8,
                           (ElementCount)uVar11);
                local_3c0 = uVar11 & 0xffffffff;
                pBVar1 = local_458.ptr[local_3c0];
                *(uint64_t *)pAVar21 = pBVar1->leafId;
                if (pBVar1->inherited == true) {
                  *(undefined2 *)(pAVar21 + 8) = 1;
                }
                else {
                  local_3d8 = uVar11;
                  capnp::schema::Brand::Scope::Builder::initBind
                            ((Builder *)&local_308,(Builder *)&stack0xfffffffffffffb68,
                             (uint)(pBVar1->params).size_);
                  uVar10 = (ulong)local_308._reader.pointers & 0xffffffff;
                  index_00 = 0;
                  for (lVar15 = 0; uVar11 = local_3d8, this_01 = local_400,
                      uVar10 * 0xa8 - lVar15 != 0; lVar15 = lVar15 + 0xa8) {
                    pBVar2 = (local_458.ptr[local_3c0]->params).ptr;
                    pEVar3 = local_3c8->errorReporter;
                    capnp::_::ListBuilder::getStructElement
                              (&local_298,(ListBuilder *)&local_308,index_00);
                    capnp::schema::Brand::Binding::Builder::initType
                              (&local_2c0,(Builder *)&local_298);
                    target._builder.capTable._0_4_ = (int)local_2c0._builder.capTable;
                    target._builder.segment = local_2c0._builder.segment;
                    target._builder.capTable._4_4_ =
                         (int)((ulong)local_2c0._builder.capTable >> 0x20);
                    target._builder.data._0_4_ = (int)local_2c0._builder.data;
                    target._builder.data._4_4_ = (int)((ulong)local_2c0._builder.data >> 0x20);
                    target._builder.pointers._0_4_ = (int)local_2c0._builder.pointers;
                    target._builder.pointers._4_4_ =
                         (int)((ulong)local_2c0._builder.pointers >> 0x20);
                    target._builder.dataSize = local_2c0._builder.dataSize;
                    target._builder._36_4_ = local_2c0._builder._36_4_;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar2->body).tag + lVar15),pEVar3,target);
                    index_00 = index_00 + 1;
                  }
                }
                uVar11 = uVar11 + 1;
              }
            }
            kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&local_458);
            uVar9 = local_108.field_1._8_8_;
            *(undefined8 *)local_1e0.content = local_108.field_1._8_8_;
            pRVar4 = this_01->resolver;
            capnp::schema::Annotation::Builder::getBrand
                      ((Builder *)&local_3b8,(Builder *)(local_218 + 0x28));
            capnp::_::StructBuilder::asReader((StructBuilder *)&local_3b8);
            (*pRVar4->_vptr_Resolver[6])(&stack0xfffffffffffffb68,pRVar4,uVar9);
            uVar9 = local_3b8.field_1._32_8_;
            local_298.segment._0_1_ = cVar16;
            if (cVar16 == '\x01') {
              local_298.capTable = (CapTableBuilder *)aVar20;
              Schema::getProto((Reader *)&local_3b8,(Schema *)&local_298.capTable);
              local_308._reader.dataSize = local_3b8.field_1._24_4_;
              local_308._reader.pointerCount = local_3b8.field_1._28_2_;
              local_308._reader._38_2_ = local_3b8.field_1._30_2_;
              local_308._reader._40_8_ = local_3b8.field_1._32_8_;
              local_308._reader.data = (void *)local_3b8.field_1._8_8_;
              local_308._reader.pointers = (WirePointer *)local_3b8.field_1._16_8_;
              local_308._reader.segment = (SegmentReader *)local_3b8._0_8_;
              local_308._reader.capTable = (CapTableReader *)local_3b8.field_1._0_8_;
              uStack_469 = (undefined1)((ulong)local_3b8.field_1._24_8_ >> 0x38);
              _local_468 = local_3b8.field_1._32_8_;
              uStack_478 = (uint)local_3b8.field_1._16_8_;
              uVar18 = (undefined1)local_3f0;
              uVar19 = (undefined7)((ulong)local_3f0 >> 8);
              name_04.content.size_ = local_3e0;
              name_04.content.ptr = local_3e8;
              pSVar12 = (SegmentBuilder *)local_3b8._0_8_;
              uVar22 = local_3b8.field_1._0_8_;
              DynamicStruct::Reader::get
                        ((Reader *)&local_3b8,(Reader *)&stack0xfffffffffffffb68,name_04);
              RVar8 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply
                                ((Reader *)&local_3b8);
              DynamicValue::Reader::~Reader((Reader *)&local_3b8);
              this_00 = (Builder *)(local_218 + 0x28);
              if (!RVar8) {
                pEVar3 = this_01->errorReporter;
                name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
                name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
                name_02._reader.data = __return_storage_ptr__;
                name_02._reader.pointers._0_1_ = uVar18;
                name_02._reader.pointers._1_7_ = uVar19;
                name_02._reader._32_8_ = pSVar12;
                name_02._reader._40_8_ = uVar22;
                expressionString(name_02);
                kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                          ((String *)&local_3b8,(kj *)0x1a7e3d,
                           (char (*) [2])&stack0xfffffffffffffb68,
                           (String *)"\' cannot be applied to this kind of declaration.",in_R8);
                pSVar13 = (SegmentBuilder *)0x1bf653;
                if ((short *)local_3b8.field_1._0_8_ != (short *)0x0) {
                  pSVar13 = (SegmentBuilder *)local_3b8._0_8_;
                }
                message_01.content.size_ =
                     local_3b8.field_1._0_8_ +
                     (ulong)((short *)local_3b8.field_1._0_8_ == (short *)0x0);
                message_01.content.ptr = (char *)pSVar13;
                ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                          (pEVar3,&local_430,message_01);
                kj::Array<char>::~Array((Array<char> *)&local_3b8);
                kj::Array<char>::~Array((Array<char> *)&stack0xfffffffffffffb68);
              }
              local_3b8._0_8_ = local_270.segment;
              local_3b8.field_1._0_8_ = local_270.capTable;
              local_3b8.field_1._8_8_ = local_270.data;
              local_3b8.field_1._16_8_ = local_270.pointers;
              uVar5._0_4_ = local_270.dataSize;
              uVar5._4_2_ = local_270.pointerCount;
              uVar5._6_2_ = local_270._38_2_;
              uVar9._0_4_ = local_270.nestingLimit;
              uVar9._4_4_ = local_270._44_4_;
              local_3b8.field_1._24_4_ = local_270.dataSize;
              local_3b8.field_1._28_2_ = local_270.pointerCount;
              local_3b8.field_1._30_2_ = local_270._38_2_;
              uVar7 = local_3b8.field_1._24_8_;
              local_3b8.field_1._32_8_ = local_270._40_8_;
              local_3b8.field_1._24_4_ = local_270.dataSize;
              if (((uint)local_3b8.field_1._24_4_ < 0x10) || (*local_270.data == 0)) {
                local_3b8.field_1._24_8_ = uVar7;
                capnp::schema::Node::Annotation::Reader::getType
                          ((Reader *)&stack0xfffffffffffffb68,&local_308);
                if ((uStack_478 < 0x10) || (*(short *)uVar22 == 0)) {
                  capnp::schema::Annotation::Builder::getValue
                            ((Builder *)&stack0xfffffffffffffb68,this_00);
                  *(short *)uVar22 = 0;
                  uVar9 = local_3b8.field_1._32_8_;
                }
                else {
                  pEVar3 = this_01->errorReporter;
                  name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
                  name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
                  name_03._reader.data = __return_storage_ptr__;
                  name_03._reader.pointers._0_1_ = uVar18;
                  name_03._reader.pointers._1_7_ = uVar19;
                  name_03._reader._32_8_ = pSVar12;
                  name_03._reader._40_8_ = uVar22;
                  expressionString(name_03);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                            ((String *)&stack0xfffffffffffffb68,(kj *)0x1a7e3d,
                             (char (*) [2])&local_2c0,(String *)"\' requires a value.",
                             (char (*) [20])in_R8);
                  pcVar14 = "";
                  if (pSVar12 != (SegmentBuilder *)0x0) {
                    pcVar14 = (char *)CONCAT71(uVar19,uVar18);
                  }
                  message_02.content.size_ =
                       (long)pSVar12 + 0x68 + ((ulong)(pSVar12 == (SegmentBuilder *)0x0) - 0x68);
                  message_02.content.ptr = pcVar14;
                  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                            (pEVar3,&local_430,message_02);
                  kj::Array<char>::~Array((Array<char> *)&stack0xfffffffffffffb68);
                  kj::Array<char>::~Array((Array<char> *)&local_2c0);
                  capnp::schema::Node::Annotation::Reader::getType(local_168,&local_308);
                  this_02 = (NodeTranslator *)local_218;
                  capnp::schema::Annotation::Builder::getValue((Builder *)this_02,this_00);
                  type._reader.capTable._0_4_ = (int)local_168[0]._reader.capTable;
                  type._reader.segment = local_168[0]._reader.segment;
                  type._reader.capTable._4_4_ = (int)((ulong)local_168[0]._reader.capTable >> 0x20);
                  type._reader.data._0_4_ = (int)local_168[0]._reader.data;
                  type._reader.data._4_4_ = (int)((ulong)local_168[0]._reader.data >> 0x20);
                  type._reader.pointers._0_4_ = (int)local_168[0]._reader.pointers;
                  type._reader.pointers._4_4_ = (int)((ulong)local_168[0]._reader.pointers >> 0x20);
                  type._reader.dataSize = (StructDataBitCount)local_168[0]._reader._32_8_;
                  type._reader._36_4_ = SUB84(local_168[0]._reader._32_8_,4);
                  type._reader.nestingLimit = (int)local_168[0]._reader._40_8_;
                  type._reader._44_4_ = SUB84(local_168[0]._reader._40_8_,4);
                  target_00._builder.capTable = (CapTableBuilder *)local_218._8_8_;
                  target_00._builder.segment = (SegmentBuilder *)local_218._0_8_;
                  target_00._builder.data = (void *)local_218._16_8_;
                  target_00._builder.pointers = (WirePointer *)local_218._24_8_;
                  target_00._builder.dataSize = local_218._32_4_;
                  target_00._builder.pointerCount = local_218._36_2_;
                  target_00._builder._38_2_ = local_218._38_2_;
                  compileDefaultDefaultValue(this_02,type,target_00);
                  uVar9 = local_3b8.field_1._32_8_;
                }
              }
              else {
                local_3b8.field_1._24_8_ = uVar5;
                if (*local_270.data == 1) {
                  local_3b8.field_1._24_8_ = uVar7;
                  Declaration::AnnotationApplication::Value::Reader::getExpression
                            (&local_198,(Reader *)&local_3b8);
                  capnp::schema::Node::Annotation::Reader::getType((Reader *)local_1c8,&local_308);
                  capnp::schema::Annotation::Builder::getValue(&local_240,this_00);
                  local_2d0.ptr.isSet = true;
                  local_2d0.ptr.field_1 =
                       (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                       local_298.capTable;
                  source_00._reader.capTable._0_4_ = (int)local_198._reader.capTable;
                  source_00._reader.segment = local_198._reader.segment;
                  source_00._reader.capTable._4_4_ =
                       (int)((ulong)local_198._reader.capTable >> 0x20);
                  source_00._reader.data._0_4_ = (int)local_198._reader.data;
                  source_00._reader.data._4_4_ = (int)((ulong)local_198._reader.data >> 0x20);
                  source_00._reader.pointers._0_4_ = (int)local_198._reader.pointers;
                  source_00._reader.pointers._4_4_ =
                       (int)((ulong)local_198._reader.pointers >> 0x20);
                  source_00._reader.dataSize = local_198._reader.dataSize;
                  source_00._reader._36_4_ = local_198._reader._36_4_;
                  source_00._reader.nestingLimit = local_198._reader.nestingLimit;
                  source_00._reader._44_4_ = local_198._reader._44_4_;
                  type_00._reader.capTable = (CapTableReader *)local_1c8._8_8_;
                  type_00._reader.segment = (SegmentReader *)local_1c8._0_8_;
                  type_00._reader.data = (void *)local_1c8._16_8_;
                  type_00._reader.pointers = (WirePointer *)local_1c8._24_8_;
                  type_00._reader.dataSize = local_1c8._32_4_;
                  type_00._reader.pointerCount = local_1c8._36_2_;
                  type_00._reader._38_2_ = local_1c8._38_2_;
                  type_00._reader._40_8_ = pAStack_1a0;
                  target_01._builder.capTable = local_240._builder.capTable;
                  target_01._builder.segment = local_240._builder.segment;
                  target_01._builder.data = local_240._builder.data;
                  target_01._builder.pointers = local_240._builder.pointers;
                  target_01._builder.dataSize = local_240._builder.dataSize;
                  target_01._builder.pointerCount = local_240._builder.pointerCount;
                  target_01._builder._38_2_ = local_240._builder._38_2_;
                  in_stack_fffffffffffffb50 = local_240._builder.pointers;
                  in_stack_fffffffffffffb58 = local_240._builder._32_8_;
                  compileBootstrapValue(this_01,source_00,type_00,target_01,&local_2d0);
                  uVar9 = local_3b8.field_1._32_8_;
                }
              }
            }
            goto LAB_0012aa6c;
          }
          pEVar3 = this_01->errorReporter;
          name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
          name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
          name_01._reader.data = __return_storage_ptr__;
          name_01._reader.pointers._0_1_ = uVar18;
          name_01._reader.pointers._1_7_ = uVar19;
          name_01._reader._32_8_ = aVar20;
          name_01._reader._40_8_ = pAVar21;
          expressionString(name_01);
          kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                    ((String *)&local_3b8,(kj *)0x1a7e3d,(char (*) [2])&stack0xfffffffffffffb68,
                     (String *)"\' is not an annotation.",(char (*) [24])in_R8);
          pSVar12 = (SegmentBuilder *)0x1bf653;
          if ((short *)local_3b8.field_1._0_8_ != (short *)0x0) {
            pSVar12 = (SegmentBuilder *)local_3b8._0_8_;
          }
          message_00.content.size_ =
               local_3b8.field_1._0_8_ + (ulong)((short *)local_3b8.field_1._0_8_ == (short *)0x0);
          message_00.content.ptr = (char *)pSVar12;
          ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                    (pEVar3,&local_430,message_00);
        }
        else {
          pEVar3 = this_01->errorReporter;
          name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb58;
          name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb50;
          name_00._reader.data = __return_storage_ptr__;
          name_00._reader.pointers._0_1_ = uVar18;
          name_00._reader.pointers._1_7_ = uVar19;
          name_00._reader._32_8_ = aVar20;
          name_00._reader._40_8_ = pAVar21;
          expressionString(name_00);
          kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                    ((String *)&local_3b8,(kj *)0x1a7e3d,(char (*) [2])&stack0xfffffffffffffb68,
                     (String *)"\' is not an annotation.",(char (*) [24])in_R8);
          pSVar12 = (SegmentBuilder *)0x1bf653;
          if ((short *)local_3b8.field_1._0_8_ != (short *)0x0) {
            pSVar12 = (SegmentBuilder *)local_3b8._0_8_;
          }
          message.content.size_ =
               local_3b8.field_1._0_8_ + (ulong)((short *)local_3b8.field_1._0_8_ == (short *)0x0);
          message.content.ptr = (char *)pSVar12;
          ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&local_430,message)
          ;
        }
        kj::Array<char>::~Array((Array<char> *)&local_3b8);
        kj::Array<char>::~Array((Array<char> *)&stack0xfffffffffffffb68);
        uVar9 = local_3b8.field_1._32_8_;
      }
LAB_0012aa6c:
      local_3b8.field_1._32_8_ = uVar9;
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_108);
      index = index + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_SOME(decl, compileDeclExpression(name, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl.getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_SOME(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema.getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      annotationSchema);
                break;
            }
          }
        }
      } else {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }